

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Performance::anon_unknown_0::RenderCountCase::calibrate(RenderCountCase *this)

{
  TestLog *log;
  int iVar1;
  State SVar2;
  undefined4 extraout_var;
  deUint64 dVar4;
  deUint64 dVar5;
  TheilSenCalibrator calibrator;
  deUint8 buffer [4];
  int iStack_258;
  RenderData occludedGeometry;
  RenderData occluderGeometry;
  long lVar3;
  
  iVar1 = (*((this->super_BaseCase).m_renderCtx)->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  log = ((this->super_BaseCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  (*(this->super_BaseCase).super_TestCase.super_TestNode._vptr_TestNode[7])(&occludedGeometry,this);
  RenderData::RenderData
            (&occluderGeometry,(ObjectData *)&occludedGeometry,(this->super_BaseCase).m_renderCtx,
             log);
  ObjectData::~ObjectData((ObjectData *)&occludedGeometry);
  (*(this->super_BaseCase).super_TestCase.super_TestNode._vptr_TestNode[8])(&calibrator,this);
  RenderData::RenderData
            (&occludedGeometry,(ObjectData *)&calibrator,(this->super_BaseCase).m_renderCtx,log);
  ObjectData::~ObjectData((ObjectData *)&calibrator);
  buffer[0] = '\x14';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  iStack_258 = 10;
  deqp::gls::TheilSenCalibrator::TheilSenCalibrator(&calibrator,(CalibratorParameters *)buffer);
  while( true ) {
    while( true ) {
      SVar2 = deqp::gls::TheilSenCalibrator::getState(&calibrator);
      if (SVar2 != STATE_RECOMPUTE_PARAMS) break;
      deqp::gls::TheilSenCalibrator::recomputeParameters(&calibrator);
    }
    if (SVar2 != STATE_MEASURE) break;
    dVar4 = deGetMicroseconds();
    (**(code **)(lVar3 + 0x188))(0x4500);
    (**(code **)(lVar3 + 0x4e8))(0xb71);
    BaseCase::render(&this->super_BaseCase,&occluderGeometry);
    BaseCase::render(&this->super_BaseCase,&occludedGeometry,calibrator.m_measureState.numDrawCalls)
    ;
    (**(code **)(lVar3 + 0x1220))(0,0,1,1,0x1908,0x1401,(CalibratorParameters *)buffer);
    dVar5 = deGetMicroseconds();
    deqp::gls::TheilSenCalibrator::recordIteration(&calibrator,dVar5 - dVar4);
  }
  iVar1 = 1;
  if (SVar2 == STATE_FINISHED) {
    deqp::gls::logCalibrationInfo
              (((this->super_BaseCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&calibrator);
    iVar1 = calibrator.m_measureState.numDrawCalls;
  }
  deqp::gls::TheilSenCalibrator::~TheilSenCalibrator(&calibrator);
  RenderData::~RenderData(&occludedGeometry);
  RenderData::~RenderData(&occluderGeometry);
  return iVar1;
}

Assistant:

int RenderCountCase::calibrate (void) const
{
	using namespace gls;

	const glw::Functions&	gl					= m_renderCtx.getFunctions();
	TestLog&				log					= m_testCtx.getLog();

	const RenderData		occluderGeometry	(genOccluderGeometry(), m_renderCtx, log);
	const RenderData		occludedGeometry	(genOccludedGeometry(), m_renderCtx, log);

	TheilSenCalibrator		calibrator			(CalibratorParameters(20, // Initial workload
																	  10, // Max iteration frames
																	  20.0f, // Iteration shortcut threshold ms
																	  20, // Max iterations
																	  33.0f, // Target frame time
																	  40.0f, // Frame time cap
																	  1000.0f // Target measurement duration
																	  ));

	while (true)
	{
		switch(calibrator.getState())
		{
			case TheilSenCalibrator::STATE_FINISHED:
				logCalibrationInfo(m_testCtx.getLog(), calibrator);
				return calibrator.getCallCount();

			case TheilSenCalibrator::STATE_MEASURE:
			{
				deUint8	buffer[4];
				deInt64 now;
				deInt64 prev;

				prev = deGetMicroseconds();

				gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
				gl.disable(GL_DEPTH_TEST);

				render(occluderGeometry);
				render(occludedGeometry, calibrator.getCallCount());

				gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, buffer);

				now = deGetMicroseconds();

				calibrator.recordIteration(now - prev);
				break;
			}

			case TheilSenCalibrator::STATE_RECOMPUTE_PARAMS:
				calibrator.recomputeParameters();
				break;
			default:
				DE_ASSERT(false);
				return 1;
		}
	}
}